

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O2

void msd_A2_adaptive(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth,
                    TempSpace *tmp)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  undefined4 uVar4;
  ushort uVar5;
  long *__ptr;
  uchar *puVar6;
  long lVar7;
  cacheblock_t *pcVar8;
  size_t sVar9;
  unsigned_long uVar10;
  uint i;
  cacheblock_t *pcVar11;
  long lVar12;
  bool bVar13;
  
  if (0xffff < N) {
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      cache_depth = 0;
    }
    TempSpace::allocate(tmp,N);
    __ptr = (long *)calloc(0x10000,8);
    puVar6 = cache->bytes + cache_depth + 1;
    sVar9 = N;
    while (bVar13 = sVar9 != 0, sVar9 = sVar9 - 1, bVar13) {
      __ptr[(ushort)(*(ushort *)(puVar6 + -1) << 8 | *(ushort *)(puVar6 + -1) >> 8)] =
           __ptr[(ushort)(*(ushort *)(puVar6 + -1) << 8 | *(ushort *)(puVar6 + -1) >> 8)] + 1;
      puVar6 = puVar6 + 0x10;
    }
    msd_A2_adaptive::bucketindex._M_elems[0] = 0;
    uVar10 = 0;
    for (lVar7 = 0; pcVar11 = cache, lVar7 != 0xffff; lVar7 = lVar7 + 1) {
      uVar10 = uVar10 + __ptr[lVar7];
      msd_A2_adaptive::bucketindex._M_elems[lVar7 + 1] = uVar10;
    }
    while (bVar13 = N != 0, N = N - 1, bVar13) {
      uVar5 = *(ushort *)(pcVar11->bytes + cache_depth) << 8 |
              *(ushort *)(pcVar11->bytes + cache_depth) >> 8;
      sVar9 = msd_A2_adaptive::bucketindex._M_elems[uVar5];
      msd_A2_adaptive::bucketindex._M_elems[uVar5] = sVar9 + 1;
      pcVar8 = TempSpace::operator[](tmp,sVar9);
      uVar1 = pcVar11->bytes[1];
      uVar2 = pcVar11->bytes[2];
      uVar3 = pcVar11->bytes[3];
      uVar4 = *(undefined4 *)&pcVar11->field_0x4;
      puVar6 = pcVar11->ptr;
      pcVar8->bytes[0] = pcVar11->bytes[0];
      pcVar8->bytes[1] = uVar1;
      pcVar8->bytes[2] = uVar2;
      pcVar8->bytes[3] = uVar3;
      *(undefined4 *)&pcVar8->field_0x4 = uVar4;
      pcVar8->ptr = puVar6;
      pcVar11 = pcVar11 + 1;
    }
    copy((EVP_PKEY_CTX *)tmp,(EVP_PKEY_CTX *)cache);
    TempSpace::deallocate(tmp);
    lVar7 = *__ptr;
    for (lVar12 = 1; lVar12 != 0x10000; lVar12 = lVar12 + 1) {
      sVar9 = __ptr[lVar12];
      if (sVar9 != 0) {
        if ((char)lVar12 != '\0') {
          msd_A2_adaptive(cache + lVar7,sVar9,cache_depth + 2,true_depth + 2,tmp);
        }
        lVar7 = lVar7 + sVar9;
      }
    }
    free(__ptr);
    return;
  }
  msd_A2(cache,N,cache_depth,true_depth,tmp);
  return;
}

Assistant:

static void
msd_A2_adaptive(cacheblock_t* cache,
                size_t N,
                size_t cache_depth,
                size_t true_depth,
                TempSpace& tmp)
{
	if (N < 0x10000) {
		msd_A2(cache, N, cache_depth, true_depth, tmp);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	tmp.allocate(N);
	size_t* bucketsize = static_cast<size_t*>(calloc(0x10000,
				sizeof(size_t)));
	for (size_t i=0; i < N; ++i) {
		uint16_t bucket =
			(cache[i].bytes[cache_depth] << 8) |
			 cache[i].bytes[cache_depth+1];
		++bucketsize[bucket];
	}
	static std::array<size_t, 0x10000> bucketindex;
	bucketindex[0] = 0;
	for (unsigned i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i) {
		uint16_t bucket = (cache[i].bytes[cache_depth] << 8)
			| cache[i].bytes[cache_depth+1];
		tmp[bucketindex[bucket]++] = cache[i];
	}
	copy(tmp, cache, N);
	tmp.deallocate();
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_A2_adaptive(cache+bsum, bucketsize[i],
				cache_depth+2, true_depth+2, tmp);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}